

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

int ON_ComparePointList(int dim,bool is_rat,int point_count,int point_strideA,double *pointA,
                       int point_strideB,double *pointB)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  double B [3];
  double A [3];
  int local_90;
  double local_68 [4];
  double local_48 [3];
  
  bVar3 = true;
  if ((0 < point_count && dim < 4) && is_rat) {
    bVar4 = ON_IsValid(pointA[dim]);
    if ((bVar4) && ((pointA[dim] != 0.0 || (NAN(pointA[dim]))))) {
      bVar4 = ON_IsValid(pointB[dim]);
      if (bVar4) {
        bVar3 = pointB[dim] == 0.0;
      }
    }
  }
  local_48[2] = 0.0;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  iVar8 = 0;
  uVar7 = 0;
  if (0 < dim) {
    uVar7 = (ulong)(uint)dim;
  }
  iVar5 = 0;
  local_90 = 0;
  while ((iVar8 < point_count && (iVar5 == 0))) {
    iVar5 = ON_ComparePoint(dim,is_rat,pointA,pointB);
    if (iVar5 != 0 && !bVar3) {
      dVar1 = pointA[dim];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        dVar2 = pointB[dim];
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
            local_48[uVar6] = pointA[uVar6] / dVar1;
            local_68[uVar6] = pointB[uVar6] / dVar2;
          }
          if (local_90 == 0) {
            local_90 = iVar5;
          }
          iVar5 = ON_ComparePoint(dim,false,local_48,local_68);
          if (iVar5 != 0) {
            iVar5 = local_90;
          }
        }
      }
    }
    pointA = pointA + point_strideA;
    pointB = pointB + point_strideB;
    iVar8 = iVar8 + 1;
  }
  return iVar5;
}

Assistant:

int 
ON_ComparePointList( // returns 
                              // -1: first < second
                              //  0: first == second
                              // +1: first > second
          int dim,
          bool is_rat,
          int point_count,
          int point_strideA,
          const double* pointA,
          int point_strideB,
          const double* pointB
          )
{
  int i, rc = 0, rc1 = 0;
  const bool bDoSecondCheck = ( 1 == is_rat && dim <= 3 && point_count > 0 
                         && ON_IsValid(pointA[dim]) && 0.0 != pointA[dim]
                         && ON_IsValid(pointB[dim]) && 0.0 != pointB[dim]
                         );
  double A[3] = {0.0,0.0,0.0};
  double B[3] = {0.0,0.0,0.0};
  //const size_t AB_size = dim*sizeof(A[0]);

  for ( i = 0; i < point_count && !rc; i++ ) 
  {
    rc = ON_ComparePoint( dim, is_rat, pointA, pointB );
    if (    rc && bDoSecondCheck 
      && 0.0 != pointA[dim] && 0.0 != pointB[dim]
      )
    {
      if ( !rc1 )
        rc1 = rc;
      // bDoSecondCheck = true ensures is_rat is true and pointX[dim] != 0.0
      for(int k = 0; k < dim; k++) 
      {
        A[k] = pointA[k]/pointA[dim];      
        B[k] = pointB[k]/pointB[dim];
      }
      rc = ( 0 == ON_ComparePoint( dim, 0, A, B ) ) ? 0 : rc1;
    }
    pointA += point_strideA;
    pointB += point_strideB;
  }

  return rc;
}